

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_error.hpp
# Opt level: O3

void __thiscall
tao::pegtl::parse_error::
parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
          (parse_error *this,string *msg,
          action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *in)

{
  pointer pcVar1;
  undefined1 local_58 [24];
  _Alloc_hider local_40;
  char local_30 [24];
  
  local_58._0_4_ = (undefined4)(in->m_begin).byte;
  local_58._4_4_ = *(undefined4 *)((long)&(in->m_begin).byte + 4);
  local_58._8_4_ = (undefined4)(in->m_begin).line;
  local_58._12_4_ = *(undefined4 *)((long)&(in->m_begin).line + 4);
  local_58._16_8_ = (in->m_begin).byte_in_line;
  pcVar1 = (in->m_input->
           super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).m_source._M_dataplus._M_p;
  local_40._M_p = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,
             pcVar1 + (in->m_input->
                      super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).m_source._M_string_length);
  parse_error(this,msg,(position *)local_58);
  if (local_40._M_p != local_30) {
    operator_delete(local_40._M_p);
  }
  return;
}

Assistant:

parse_error( const std::string& msg, const Input& in )
            : parse_error( msg, in.position() )
         {
         }